

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O3

int __thiscall
CVmObjLookupTable::index_check(CVmObjLookupTable *this,vm_val_t *result,vm_val_t *idx)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  undefined4 uVar2;
  vm_lookup_val *pvVar3;
  
  pvVar3 = find_entry(this,idx,(uint *)0x0,(vm_lookup_val **)0x0);
  if (pvVar3 == (vm_lookup_val *)0x0) {
    result->typ = VM_NIL;
  }
  else {
    uVar2 = *(undefined4 *)&(pvVar3->val).field_0x4;
    aVar1 = (pvVar3->val).val;
    result->typ = (pvVar3->val).typ;
    *(undefined4 *)&result->field_0x4 = uVar2;
    result->val = aVar1;
  }
  return (uint)(pvVar3 != (vm_lookup_val *)0x0);
}

Assistant:

int CVmObjLookupTable::index_check(VMG_ vm_val_t *result, const vm_val_t *idx)
{
    /* find the entry */
    vm_lookup_val *entry = find_entry(vmg_ idx, 0, 0);

    /* if we found it, return it; otherwise, return nil */
    if (entry != 0)
    {
        /* get the indexed value */
        *result = entry->val;

        /* indicate that the key is present is in the table */
        return TRUE;
    }
    else
    {
        /* 
         *   not found - set a nil result value and indicate that the key
         *   isn't in the table 
         */
        result->set_nil();
        return FALSE;
    }
}